

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegVideo.cpp
# Opt level: O0

bool __thiscall
MPEGRawDataHeader::addRawData
          (MPEGRawDataHeader *this,uint8_t *buffer,int len,bool headerIncluded,bool isHeader)

{
  bool bVar1;
  bool isHeader_local;
  bool headerIncluded_local;
  int len_local;
  uint8_t *buffer_local;
  MPEGRawDataHeader *this_local;
  
  bVar1 = this->m_data_buffer_len + len <= this->m_max_data_len;
  if (bVar1) {
    this->m_headerIncludedToBuff = headerIncluded;
    memcpy(this->m_data_buffer + this->m_data_buffer_len,buffer,(long)len);
    this->m_data_buffer_len = len + this->m_data_buffer_len;
  }
  return bVar1;
}

Assistant:

bool MPEGRawDataHeader::addRawData(uint8_t* buffer, const int len, const bool headerIncluded, bool isHeader)
{
    if (m_data_buffer_len + len > m_max_data_len)
    {
        return false;
    }
    m_headerIncludedToBuff = headerIncluded;
    memcpy(m_data_buffer + m_data_buffer_len, buffer, len);
    m_data_buffer_len += len;
    return true;
}